

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::Builder::makeReg(Builder *this,string *identifier)

{
  string *hint;
  char *pcVar1;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Builder *this_00;
  shared_ptr<mocker::ir::Reg> sVar3;
  shared_ptr<mocker::ir::Reg> instancePtr;
  shared_ptr<mocker::ir::Reg> instancePtrPtr;
  string varName;
  string className;
  allocator<char> local_b9;
  undefined1 local_b8 [16];
  shared_ptr<mocker::ir::Reg> local_a8;
  undefined1 local_98 [32];
  string local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDX);
  if (*pcVar1 != '@') {
    this_00 = (Builder *)0x0;
    pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDX);
    if (*pcVar1 == '#') {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_98[0x10] = 0;
      splitMemberVarIdent(&local_58,this_00,in_RDX);
      local_a8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_98;
      local_a8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
      std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_a8,&local_58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_58);
      std::make_shared<mocker::ir::Reg,char_const(&)[5]>((char (*) [5])&local_a8);
      hint = (string *)identifier->_M_string_length;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"instPtr",&local_b9);
      BuilderContext::makeTempLocalReg((BuilderContext *)local_b8,hint);
      std::__cxx11::string::~string((string *)&local_58);
      BuilderContext::
      emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)identifier->_M_string_length,
                 (shared_ptr<mocker::ir::Reg> *)local_b8,&local_a8);
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
      getMemberElementPtr(this,(shared_ptr<mocker::ir::Addr> *)identifier,&local_58.first,&local_78)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.first._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_a8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&local_78);
      _Var2._M_pi = extraout_RDX;
      goto LAB_001368d0;
    }
  }
  sVar3 = std::make_shared<mocker::ir::Reg,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  _Var2 = sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_001368d0:
  sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> Builder::makeReg(std::string identifier) const {
  if (identifier.at(0) == '@') // is global variable
    return std::make_shared<Reg>(std::move(identifier));
  if (identifier.at(0) == '#') { // is member variable
    std::string className, varName;
    std::tie(className, varName) = splitMemberVarIdent(identifier);
    auto instancePtrPtr = std::make_shared<Reg>("this");
    auto instancePtr = ctx.makeTempLocalReg("instPtr");
    ctx.emplaceInst<Load>(instancePtr, instancePtrPtr);
    return getMemberElementPtr(instancePtr, className, varName);
  }
  return std::make_shared<Reg>(std::move(identifier));
}